

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             *this,basic_string_view<char> value)

{
  char spec;
  basic_string_view<char> s;
  iterator iVar1;
  size_t in_RCX;
  error_handler local_29;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_28;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  basic_string_view<char> value_local;
  
  value_local.data_ = (char *)value.size_;
  this_local = (arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *)value.data_;
  local_28 = this;
  if (this->specs_ == (format_specs *)0x0) {
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::write(&this->writer_,(int)value.data_,value_local.data_,in_RCX);
  }
  else {
    spec = this->specs_->type_;
    error_handler::error_handler(&local_29);
    check_string_type_spec<char,fmt::v5::internal::error_handler>(spec,&local_29);
    s.size_ = (size_t)value_local.data_;
    s.data_ = (char *)this_local;
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::write_str<char>(&this->writer_,s,this->specs_);
  }
  iVar1 = out(this);
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type_, internal::error_handler());
      writer_.write_str(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }